

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

node * init_node(void)

{
  node *in_RDI;
  node *node;
  node_pred *local_20;
  node_pred *local_18;
  node_pred *local_10;
  size_t local_8;
  
  in_RDI->parent = 0;
  in_RDI->min_count = 0;
  v_init<node_pred>();
  (in_RDI->preds)._begin = local_20;
  (in_RDI->preds)._end = local_18;
  (in_RDI->preds).end_array = local_10;
  (in_RDI->preds).erase_count = local_8;
  init_leaf((node *)0x2a2b06);
  return in_RDI;
}

Assistant:

inline node init_node()
{
  node node;

  node.parent = 0;
  node.min_count = 0;
  node.preds = v_init<node_pred>();
  init_leaf(node);

  return node;
}